

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelLight.cpp
# Opt level: O0

Color __thiscall ParallelLight::diffuse(ParallelLight *this,vec3 hitpoint,shared_ptr<Obj> *object)

{
  vec4 left;
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  undefined8 extraout_RDX;
  double dVar3;
  tvec4<float,_(glm::precision)0> right;
  Color local_9c;
  double diffuseFactor;
  vec4 normal;
  shared_ptr<Obj> *object_local;
  ParallelLight *this_local;
  vec3 hitpoint_local;
  Color result;
  
  hitpoint_local.field_0.field_0.x = (float)hitpoint.field_0._8_4_;
  peVar2 = std::__shared_ptr_access<Obj,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Obj,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)object);
  iVar1 = (*peVar2->_vptr_Obj[2])(hitpoint.field_0._0_4_,hitpoint_local.field_0.field_0.x);
  left.field_0.field_0.y = (float)extraout_var;
  left.field_0.field_0.x = (float)iVar1;
  right = glm::operator-((glm *)&(this->super_Light).field_0xc,
                         (tvec4<float,_(glm::precision)0> *)object);
  left.field_0._8_8_ = extraout_RDX;
  dVar3 = Obj::dot(left,(vec4)right.field_0);
  dVar3 = dVar3 * 255.0;
  Color::Color((Color *)((long)&hitpoint_local.field_0 + 5),dVar3,dVar3,dVar3);
  local_9c.b = hitpoint_local.field_0._7_1_;
  local_9c.r = hitpoint_local.field_0._5_1_;
  local_9c.g = hitpoint_local.field_0._6_1_;
  return local_9c;
}

Assistant:

Color ParallelLight::diffuse(glm::vec3 hitpoint, std::shared_ptr<Obj> object) {
    glm::vec4 normal = object->getNormal(hitpoint);
    double diffuseFactor = Obj::dot(normal, -direction);
    Color result(diffuseFactor * 255, diffuseFactor * 255, diffuseFactor * 255);
    return result;
}